

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O0

int callback_cancel(uint id)

{
  int in_EDI;
  callback_t *p;
  callback_t *local_10;
  
  local_10 = gCallBackFirst;
  while( true ) {
    if (local_10 == (callback_t *)0x0) {
      return -0x7da;
    }
    if (local_10->id == in_EDI) break;
    local_10 = local_10->next;
  }
  if (local_10->prev == (callback_t *)0x0) {
    gCallBackFirst = local_10->next;
  }
  else {
    local_10->prev->next = local_10->next;
  }
  if (local_10->next == (callback_t *)0x0) {
    gCallBackLast = local_10->prev;
  }
  else {
    local_10->next->prev = local_10->prev;
  }
  free(local_10);
  findNotifyBits();
  return 0;
}

Assistant:

int callback_cancel(unsigned id)
{
   callback_t *p;

   p = gCallBackFirst;

   while (p)
   {
      if (p->id == id)
      {
         if (p->prev) p->prev->next = p->next;
         else gCallBackFirst = p->next;

         if (p->next) p->next->prev = p->prev;
         else gCallBackLast = p->prev;

         free(p);

         findNotifyBits();

         return 0;
      }
      p = p->next;
   }
   return pigif_callback_not_found;
}